

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void create_node_scope(c2m_ctx_t c2m_ctx,node_t_conflict node)

{
  uint uVar1;
  check_ctx *pcVar2;
  node_t_conflict pnVar3;
  undefined1 *puVar4;
  
  pcVar2 = c2m_ctx->check_ctx;
  puVar4 = (undefined1 *)reg_malloc(c2m_ctx,0x28);
  pnVar3 = pcVar2->curr_scope;
  if (pnVar3 != node) {
    uVar1 = pcVar2->curr_func_scope_num;
    pcVar2->curr_func_scope_num = uVar1 + 1;
    *(uint *)(puVar4 + 4) = uVar1;
    *puVar4 = 0;
    *(undefined8 *)(puVar4 + 0x18) = 0;
    *(undefined8 *)(puVar4 + 8) = 0;
    *(undefined8 *)(puVar4 + 0x10) = 0;
    node->attr = puVar4;
    *(node_t_conflict *)(puVar4 + 0x20) = pnVar3;
    pcVar2->curr_scope = node;
    return;
  }
  __assert_fail("node != curr_scope",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x190f,"void create_node_scope(c2m_ctx_t, node_t)");
}

Assistant:

static void create_node_scope (c2m_ctx_t c2m_ctx, node_t node) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  struct node_scope *ns = reg_malloc (c2m_ctx, sizeof (struct node_scope));

  assert (node != curr_scope);
  ns->func_scope_num = curr_func_scope_num++;
  ns->stack_var_p = FALSE;
  ns->offset = ns->size = ns->call_arg_area_size = 0;
  node->attr = ns;
  ns->scope = curr_scope;
  curr_scope = node;
}